

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult PrintArguments(ShellState *state,char **azArg,idx_t nArg)

{
  idx_t i;
  ulong uVar1;
  
  for (uVar1 = 1; uVar1 < nArg; uVar1 = uVar1 + 1) {
    if (1 < uVar1) {
      fputc(0x20,(FILE *)state->out);
    }
    fputs(azArg[uVar1],(FILE *)state->out);
  }
  fputc(10,(FILE *)state->out);
  return SUCCESS;
}

Assistant:

MetadataResult PrintArguments(ShellState &state, const char **azArg, idx_t nArg) {
	for (idx_t i = 1; i < nArg; i++) {
		if (i > 1) {
			raw_printf(state.out, " ");
		}
		utf8_printf(state.out, "%s", azArg[i]);
	}
	raw_printf(state.out, "\n");
	return MetadataResult::SUCCESS;
}